

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O1

void __thiscall
TPZMatrix<Fad<long_double>_>::Diagonal(TPZMatrix<Fad<long_double>_> *this,Fad<long_double> *val)

{
  long lVar1;
  long lVar2;
  Fad<long_double> local_68;
  
  if ((this->super_TPZBaseMatrix).fCol != (this->super_TPZBaseMatrix).fRow) {
    Error("Diagonal (TPZMatrix<>*) <TPZMatrix<>must be square>",(char *)0x0);
  }
  if (0 < (this->super_TPZBaseMatrix).fRow) {
    lVar2 = 0;
    do {
      if (0 < (this->super_TPZBaseMatrix).fCol) {
        lVar1 = 0;
        do {
          if (lVar2 == lVar1) {
            (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                      (this,lVar2,lVar1,val);
          }
          else {
            local_68.val_ = (longdouble)0;
            local_68.dx_.num_elts = 0;
            local_68.dx_.ptr_to_data = (longdouble *)0x0;
            local_68.defaultVal._0_8_ = 0;
            local_68.defaultVal._8_2_ = 0;
            (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                      (this,lVar2,lVar1,&local_68);
            Fad<long_double>::~Fad(&local_68);
          }
          lVar1 = lVar1 + 1;
        } while (lVar1 < (this->super_TPZBaseMatrix).fCol);
      }
      lVar2 = lVar2 + 1;
    } while (lVar2 < (this->super_TPZBaseMatrix).fRow);
  }
  return;
}

Assistant:

void TPZMatrix<TVar>::Diagonal(TVar val) {
    
    if ( Cols() != Rows() ) {
        Error( "Diagonal (TPZMatrix<>*) <TPZMatrix<>must be square>" );
    }
    for ( int64_t row = 0; row < Rows(); row++) {
        for ( int64_t col = 0; col < Cols(); col++ ) {
            (row == col)? PutVal(row,col,val):PutVal(row,col,0.);
        }
    }
}